

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O0

bool anon_unknown.dwarf_3c7d63::typeMatches(SemanticModel *semaModel,Type *ty,Ty *t)

{
  Type *pTVar1;
  Ty *ty_00;
  Type *semaModel_00;
  bool bVar2;
  TypeKind TVar3;
  TypeKind TVar4;
  BasicTypeKind BVar5;
  TagTypeKind TVar6;
  size_type sVar7;
  size_type sVar8;
  const_reference pvVar9;
  QualifiedType *pQVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  ArrayType *this;
  PointerType *pPVar13;
  ulong uVar14;
  reference ppTVar15;
  const_reference t_00;
  element_type *t_01;
  ostream *poVar16;
  void *this_00;
  undefined8 uVar17;
  BasicType *this_01;
  TypedefNameType *this_02;
  TagType *pTVar18;
  Lexeme *pLVar19;
  char *pcVar20;
  bool local_4d9;
  byte local_4b9;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  byte local_359;
  string local_358;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  Type *local_1b8;
  Type *parmTy;
  int local_1a8;
  uint i_1;
  string local_1a0;
  undefined1 local_180 [8];
  ParameterTypes parmTys;
  FunctionType *funcTy;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  value_type local_98;
  allocator<char> local_91;
  value_type derivPtrTyDecay;
  TypeKind local_6d;
  value_type derivTyK;
  allocator<char> local_59;
  string local_58;
  CVR local_34;
  size_type sStack_30;
  value_type derivTyCVR;
  size_type i;
  Ty *t_local;
  Type *ty_local;
  SemanticModel *semaModel_local;
  
  i = (size_type)t;
  t_local = (Ty *)ty;
  ty_local = (Type *)semaModel;
  sVar7 = std::vector<TypeKind,_std::allocator<TypeKind>_>::size(&t->derivTyKs_);
  sVar8 = std::vector<psy::C::CVR,_std::allocator<psy::C::CVR>_>::size
                    ((vector<psy::C::CVR,_std::allocator<psy::C::CVR>_> *)(i + 0x48));
  if (sVar7 == sVar8) {
    sVar7 = std::vector<TypeKind,_std::allocator<TypeKind>_>::size
                      ((vector<TypeKind,_std::allocator<TypeKind>_> *)(i + 0x30));
    sVar8 = std::vector<psy::C::Decay,_std::allocator<psy::C::Decay>_>::size
                      ((vector<psy::C::Decay,_std::allocator<psy::C::Decay>_> *)(i + 0x60));
    if (sVar7 == sVar8) {
      for (sStack_30 = std::vector<TypeKind,_std::allocator<TypeKind>_>::size
                                 ((vector<TypeKind,_std::allocator<TypeKind>_> *)(i + 0x30));
          sStack_30 != 0; sStack_30 = sStack_30 - 1) {
        pvVar9 = std::vector<psy::C::CVR,_std::allocator<psy::C::CVR>_>::operator[]
                           ((vector<psy::C::CVR,_std::allocator<psy::C::CVR>_> *)(i + 0x48),
                            sStack_30 - 1);
        local_34 = *pvVar9;
        t_local = (Ty *)synonymizedType((SemanticModel *)ty_local,(Type *)t_local);
        bVar2 = CVRMatches((Type *)t_local,local_34);
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"derived type CVR",&local_59);
          DETAIL_MISMATCH(&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::allocator<char>::~allocator(&local_59);
          semaModel_local._7_1_ = 0;
          goto LAB_0058cbfa;
        }
        TVar3 = psy::C::Type::kind((Type *)t_local);
        if (TVar3 == Qualified) {
          pQVar10 = (QualifiedType *)
                    (*(code *)(t_local->decl_->ty_).derivPtrTyDecay_.
                              super__Vector_base<psy::C::Decay,_std::allocator<psy::C::Decay>_>.
                              _M_impl.super__Vector_impl_data._M_start)();
          t_local = (Ty *)psy::C::QualifiedType::unqualifiedType(pQVar10);
        }
        t_local = (Ty *)synonymizedType((SemanticModel *)ty_local,(Type *)t_local);
        pvVar11 = std::vector<TypeKind,_std::allocator<TypeKind>_>::operator[]
                            ((vector<TypeKind,_std::allocator<TypeKind>_> *)(i + 0x30),sStack_30 - 1
                            );
        TVar3 = *pvVar11;
        local_6d = TVar3;
        TVar4 = psy::C::Type::kind((Type *)t_local);
        if (TVar3 != TVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&derivPtrTyDecay,"derived array/pointer/function type kind",&local_91
                    );
          DETAIL_MISMATCH((string *)&derivPtrTyDecay);
          std::__cxx11::string::~string((string *)&derivPtrTyDecay);
          std::allocator<char>::~allocator(&local_91);
          semaModel_local._7_1_ = 0;
          goto LAB_0058cbfa;
        }
        pvVar12 = std::vector<psy::C::Decay,_std::allocator<psy::C::Decay>_>::operator[]
                            ((vector<psy::C::Decay,_std::allocator<psy::C::Decay>_> *)(i + 0x60),
                             sStack_30 - 1);
        local_98 = *pvVar12;
        TVar3 = psy::C::Type::kind((Type *)t_local);
        if (TVar3 == Array) {
          if (local_98 != None) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b8,"can\'t happen for array",&local_b9);
            DETAIL_MISMATCH(&local_b8);
            std::__cxx11::string::~string((string *)&local_b8);
            std::allocator<char>::~allocator(&local_b9);
            semaModel_local._7_1_ = 0;
            goto LAB_0058cbfa;
          }
          this = (ArrayType *)(**(code **)((long)&(t_local->decl_->ident_).field_2 + 8))();
          t_local = (Ty *)psy::C::ArrayType::elementType(this);
          t_local = (Ty *)synonymizedType((SemanticModel *)ty_local,(Type *)t_local);
        }
        else if (TVar3 == Function) {
          if (local_98 != None) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_158,"can\'t happen for function",
                       (allocator<char> *)((long)&funcTy + 7));
            DETAIL_MISMATCH(&local_158);
            std::__cxx11::string::~string((string *)&local_158);
            std::allocator<char>::~allocator((allocator<char> *)((long)&funcTy + 7));
            semaModel_local._7_1_ = 0;
            goto LAB_0058cbfa;
          }
          parmTys.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(*(code *)(t_local->decl_->ty_).ident_._M_string_length)();
          psy::C::FunctionType::parameterTypes
                    ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)
                     local_180,
                     (FunctionType *)
                     parmTys.
                     super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar7 = std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::size
                            ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)
                             local_180);
          sVar8 = std::vector<psy::C::Ty,_std::allocator<psy::C::Ty>_>::size
                            ((vector<psy::C::Ty,_std::allocator<psy::C::Ty>_> *)(i + 0x88));
          if (sVar7 == sVar8) {
            for (parmTy._4_4_ = 0; uVar14 = (ulong)parmTy._4_4_,
                sVar7 = std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::
                        size((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)
                             local_180), uVar14 < sVar7; parmTy._4_4_ = parmTy._4_4_ + 1) {
              ppTVar15 = std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::
                         operator[]((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                                     *)local_180,(ulong)parmTy._4_4_);
              semaModel_00 = ty_local;
              pTVar1 = *ppTVar15;
              local_1b8 = pTVar1;
              t_00 = std::vector<psy::C::Ty,_std::allocator<psy::C::Ty>_>::operator[]
                               ((vector<psy::C::Ty,_std::allocator<psy::C::Ty>_> *)(i + 0x88),
                                (ulong)parmTy._4_4_);
              bVar2 = typeMatches((SemanticModel *)semaModel_00,pTVar1,t_00);
              if (!bVar2) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1d8,"parameter type mismatch",&local_1d9);
                DETAIL_MISMATCH(&local_1d8);
                std::__cxx11::string::~string((string *)&local_1d8);
                std::allocator<char>::~allocator(&local_1d9);
                semaModel_local._7_1_ = 0;
                local_1a8 = 1;
                goto LAB_0058c2d6;
              }
            }
            t_local = (Ty *)psy::C::FunctionType::returnType
                                      ((FunctionType *)
                                       parmTys.
                                       super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            t_local = (Ty *)synonymizedType((SemanticModel *)ty_local,(Type *)t_local);
            bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(i + 0x78));
            pTVar1 = ty_local;
            ty_00 = t_local;
            if (bVar2) {
              t_01 = std::__shared_ptr<psy::C::Ty,_(__gnu_cxx::_Lock_policy)2>::get
                               ((__shared_ptr<psy::C::Ty,_(__gnu_cxx::_Lock_policy)2> *)(i + 0x78));
              bVar2 = typeMatches((SemanticModel *)pTVar1,(Type *)ty_00,t_01);
              if (bVar2) {
                semaModel_local._7_1_ = 1;
                local_1a8 = 1;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_200,"nested return type mismatch",&local_201);
                DETAIL_MISMATCH(&local_200);
                std::__cxx11::string::~string((string *)&local_200);
                std::allocator<char>::~allocator(&local_201);
                semaModel_local._7_1_ = 0;
                local_1a8 = 1;
              }
            }
            else {
              local_1a8 = 7;
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,"number of parameters",
                       (allocator<char> *)((long)&i_1 + 3));
            DETAIL_MISMATCH(&local_1a0);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
            semaModel_local._7_1_ = 0;
            local_1a8 = 1;
          }
LAB_0058c2d6:
          std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::~vector
                    ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)
                     local_180);
          if (local_1a8 == 1) goto LAB_0058cbfa;
        }
        else {
          if (TVar3 != Pointer) {
            poVar16 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar16 = std::operator<<(poVar16,"\tReason: ");
            poVar16 = std::operator<<(poVar16,"unexpected");
            poVar16 = std::operator<<(poVar16,"\n");
            poVar16 = std::operator<<(poVar16,"\t\t");
            poVar16 = std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                     );
            poVar16 = std::operator<<(poVar16,":");
            this_00 = (void *)std::ostream::operator<<(poVar16,0x24f);
            std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
            uVar17 = __cxa_allocate_exception(1);
            __cxa_throw(uVar17,&psy::TestFailed::typeinfo,0);
          }
          if (local_98 == None) {
            pPVar13 = (PointerType *)
                      (**(code **)((long)&(t_local->decl_->ty_).ident_.field_2 + 8))();
            bVar2 = psy::C::PointerType::arisesFromFunctionDecay(pPVar13);
            if (!bVar2) {
              pPVar13 = (PointerType *)
                        (**(code **)((long)&(t_local->decl_->ty_).ident_.field_2 + 8))();
              bVar2 = psy::C::PointerType::arisesFromArrayDecay(pPVar13);
              if (!bVar2) goto LAB_0058be3d;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e0,"pointer type is decayed from array/function",&local_e1);
            DETAIL_MISMATCH(&local_e0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::allocator<char>::~allocator(&local_e1);
            semaModel_local._7_1_ = 0;
            goto LAB_0058cbfa;
          }
          if (local_98 == FromArrayToPointer) {
            pPVar13 = (PointerType *)
                      (**(code **)((long)&(t_local->decl_->ty_).ident_.field_2 + 8))();
            bVar2 = psy::C::PointerType::arisesFromArrayDecay(pPVar13);
            if (!bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_130,"pointer type isn\'t (array) decayed",&local_131);
              DETAIL_MISMATCH(&local_130);
              std::__cxx11::string::~string((string *)&local_130);
              std::allocator<char>::~allocator(&local_131);
              semaModel_local._7_1_ = 0;
              goto LAB_0058cbfa;
            }
          }
          else if (local_98 == FromFunctionToFunctionPointer) {
            pPVar13 = (PointerType *)
                      (**(code **)((long)&(t_local->decl_->ty_).ident_.field_2 + 8))();
            bVar2 = psy::C::PointerType::arisesFromFunctionDecay(pPVar13);
            if (!bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_108,"pointer type isn\'t (function) decayed",&local_109);
              DETAIL_MISMATCH(&local_108);
              std::__cxx11::string::~string((string *)&local_108);
              std::allocator<char>::~allocator(&local_109);
              semaModel_local._7_1_ = 0;
              goto LAB_0058cbfa;
            }
          }
LAB_0058be3d:
          pPVar13 = (PointerType *)(**(code **)((long)&(t_local->decl_->ty_).ident_.field_2 + 8))();
          t_local = (Ty *)psy::C::PointerType::referencedType(pPVar13);
          t_local = (Ty *)synonymizedType((SemanticModel *)ty_local,(Type *)t_local);
        }
      }
      t_local = (Ty *)resolvedSynonymizedType((SemanticModel *)ty_local,(Type *)t_local);
      bVar2 = CVRMatches((Type *)t_local,*(CVR *)(i + 0x2c));
      if (bVar2) {
        TVar3 = psy::C::Type::kind((Type *)t_local);
        if (TVar3 == Qualified) {
          pQVar10 = (QualifiedType *)
                    (*(code *)(t_local->decl_->ty_).derivPtrTyDecay_.
                              super__Vector_base<psy::C::Decay,_std::allocator<psy::C::Decay>_>.
                              _M_impl.super__Vector_impl_data._M_start)();
          t_local = (Ty *)psy::C::QualifiedType::unqualifiedType(pQVar10);
        }
        t_local = (Ty *)resolvedSynonymizedType((SemanticModel *)ty_local,(Type *)t_local);
        TVar3 = psy::C::Type::kind((Type *)t_local);
        if (TVar3 == Qualified) {
          pQVar10 = (QualifiedType *)
                    (*(code *)(t_local->decl_->ty_).derivPtrTyDecay_.
                              super__Vector_base<psy::C::Decay,_std::allocator<psy::C::Decay>_>.
                              _M_impl.super__Vector_impl_data._M_start)();
          t_local = (Ty *)psy::C::QualifiedType::unqualifiedType(pQVar10);
        }
        TVar3 = psy::C::Type::kind((Type *)t_local);
        if (TVar3 == *(TypeKind *)(i + 0x28)) {
          TVar3 = psy::C::Type::kind((Type *)t_local);
          switch(TVar3) {
          case Basic:
            this_01 = (BasicType *)(*(code *)(t_local->decl_->ty_).decl_)();
            BVar5 = psy::C::BasicType::kind(this_01);
            if (BVar5 != *(BasicTypeKind *)(i + 0x29)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_278,"basic type mismatch",&local_279);
              DETAIL_MISMATCH(&local_278);
              std::__cxx11::string::~string((string *)&local_278);
              std::allocator<char>::~allocator(&local_279);
              semaModel_local._7_1_ = 0;
              goto LAB_0058cbfa;
            }
            break;
          default:
            poVar16 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
            poVar16 = std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                     );
            poVar16 = std::operator<<(poVar16,":");
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,0x28f);
            poVar16 = std::operator<<(poVar16," ");
            poVar16 = std::operator<<(poVar16,"<empty message>");
            std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
            semaModel_local._7_1_ = 0;
            goto LAB_0058cbfa;
          case TypedefName:
            this_02 = (TypedefNameType *)
                      (*(code *)(t_local->decl_->ty_).derivTyKs_.
                                super__Vector_base<TypeKind,_std::allocator<TypeKind>_>._M_impl.
                                super__Vector_impl_data._M_start)();
            pLVar19 = &psy::C::TypedefNameType::typedefName(this_02)->super_Lexeme;
            psy::C::Lexeme::valueText_abi_cxx11_(&local_2c8,pLVar19);
            bVar2 = std::operator!=(&local_2c8,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(i + 8));
            std::__cxx11::string::~string((string *)&local_2c8);
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2e8,"typedef name mismatch",&local_2e9);
              DETAIL_MISMATCH(&local_2e8);
              std::__cxx11::string::~string((string *)&local_2e8);
              std::allocator<char>::~allocator(&local_2e9);
              semaModel_local._7_1_ = 0;
              goto LAB_0058cbfa;
            }
            break;
          case Tag:
            pTVar18 = (TagType *)
                      (*(code *)(t_local->decl_->ty_).derivTyKs_.
                                super__Vector_base<TypeKind,_std::allocator<TypeKind>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage)();
            TVar6 = psy::C::TagType::kind(pTVar18);
            if (TVar6 != *(TagTypeKind *)(i + 0x2a)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_310,"tag type mismatch",&local_311);
              DETAIL_MISMATCH(&local_310);
              std::__cxx11::string::~string((string *)&local_310);
              std::allocator<char>::~allocator(&local_311);
              semaModel_local._7_1_ = 0;
              goto LAB_0058cbfa;
            }
            pTVar18 = (TagType *)
                      (*(code *)(t_local->decl_->ty_).derivTyKs_.
                                super__Vector_base<TypeKind,_std::allocator<TypeKind>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage)();
            pLVar19 = &psy::C::TagType::tag(pTVar18)->super_Lexeme;
            psy::C::Lexeme::valueText_abi_cxx11_(&local_338,pLVar19);
            bVar2 = std::operator!=(&local_338,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(i + 8));
            local_359 = 0;
            local_4b9 = 0;
            if (bVar2) {
              pTVar18 = (TagType *)
                        (*(code *)(t_local->decl_->ty_).derivTyKs_.
                                  super__Vector_base<TypeKind,_std::allocator<TypeKind>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage)();
              pLVar19 = &psy::C::TagType::tag(pTVar18)->super_Lexeme;
              psy::C::Lexeme::valueText_abi_cxx11_(&local_358,pLVar19);
              local_359 = 1;
              pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)&local_358);
              local_4d9 = false;
              if (*pcVar20 == '#') {
                local_4d9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(i + 8),"");
              }
              local_4b9 = local_4d9 ^ 0xff;
            }
            if ((local_359 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_358);
            }
            std::__cxx11::string::~string((string *)&local_338);
            if ((local_4b9 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_380,"tag mismatch",&local_381);
              DETAIL_MISMATCH(&local_380);
              std::__cxx11::string::~string((string *)&local_380);
              std::allocator<char>::~allocator(&local_381);
              semaModel_local._7_1_ = 0;
              goto LAB_0058cbfa;
            }
            break;
          case Void:
            if (*(char *)(i + 0x28) != '\x06') {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2a0,"void type mismatch",&local_2a1);
              DETAIL_MISMATCH(&local_2a0);
              std::__cxx11::string::~string((string *)&local_2a0);
              std::allocator<char>::~allocator(&local_2a1);
              semaModel_local._7_1_ = 0;
              goto LAB_0058cbfa;
            }
            break;
          case Error:
            if (*(char *)(i + 0x28) != '\b') {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3a8,"unknown type mismatch",&local_3a9);
              DETAIL_MISMATCH(&local_3a8);
              std::__cxx11::string::~string((string *)&local_3a8);
              std::allocator<char>::~allocator(&local_3a9);
              semaModel_local._7_1_ = 0;
              goto LAB_0058cbfa;
            }
          }
          semaModel_local._7_1_ = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,"basic/void/typedef/tag type mismatch",&local_251);
          DETAIL_MISMATCH(&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          std::allocator<char>::~allocator(&local_251);
          semaModel_local._7_1_ = 0;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"type CVR",&local_229);
        DETAIL_MISMATCH(&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator(&local_229);
        semaModel_local._7_1_ = 0;
      }
      goto LAB_0058cbfa;
    }
  }
  poVar16 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
  poVar16 = std::operator<<(poVar16,
                            "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                           );
  poVar16 = std::operator<<(poVar16,":");
  poVar16 = (ostream *)std::ostream::operator<<(poVar16,0x1f0);
  poVar16 = std::operator<<(poVar16," ");
  poVar16 = std::operator<<(poVar16,"<empty message>");
  std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
  semaModel_local._7_1_ = 0;
LAB_0058cbfa:
  return (bool)(semaModel_local._7_1_ & 1);
}

Assistant:

bool typeMatches(const SemanticModel* semaModel,
                 const Type* ty,
                 const Ty& t)
{
    PSY_ASSERT_2(t.derivTyKs_.size() == t.derivTyCVRs_.size()
                    && t.derivTyKs_.size() == t.derivPtrTyDecay_.size(),
                 return false);

    for (auto i = t.derivTyKs_.size(); i > 0; --i) {
        auto derivTyCVR = t.derivTyCVRs_[i - 1];

        ty = synonymizedType(semaModel, ty);
        if (!CVRMatches(ty, derivTyCVR)) {
            DETAIL_MISMATCH("derived type CVR");
            return false;
        }
        if (ty->kind() == TypeKind::Qualified)
            ty = ty->asQualifiedType()->unqualifiedType();
        ty = synonymizedType(semaModel, ty);

        auto derivTyK = t.derivTyKs_[i - 1];
        if (derivTyK != ty->kind()) {
            DETAIL_MISMATCH("derived array/pointer/function type kind");
            return false;
        }

        auto derivPtrTyDecay = t.derivPtrTyDecay_[i - 1];

        switch (ty->kind()) {
            case TypeKind::Array:
                if (derivPtrTyDecay != Decay::None) {
                    DETAIL_MISMATCH("can't happen for array");
                    return false;
                }
                ty = ty->asArrayType()->elementType();
                ty = synonymizedType(semaModel, ty);
                break;

            case TypeKind::Pointer:
                switch (derivPtrTyDecay) {
                    case Decay::None:
                        if (ty->asPointerType()->arisesFromFunctionDecay()
                                    || ty->asPointerType()->arisesFromArrayDecay()) {
                            DETAIL_MISMATCH("pointer type is decayed from array/function");
                            return false;
                        }
                        break;

                    case Decay::FromFunctionToFunctionPointer:
                        if (!ty->asPointerType()->arisesFromFunctionDecay()) {
                            DETAIL_MISMATCH("pointer type isn't (function) decayed");
                            return false;
                        }
                        break;

                    case Decay::FromArrayToPointer:
                        if (!ty->asPointerType()->arisesFromArrayDecay()) {
                            DETAIL_MISMATCH("pointer type isn't (array) decayed");
                            return false;
                        }
                        break;
                }
                ty = ty->asPointerType()->referencedType();
                ty = synonymizedType(semaModel, ty);
                break;

            case TypeKind::Function: {
                if (derivPtrTyDecay != Decay::None) {
                    DETAIL_MISMATCH("can't happen for function");
                    return false;
                }

                auto funcTy = ty->asFunctionType();
                auto parmTys = funcTy->parameterTypes();
                if (parmTys.size() != t.parmsTys_.size()) {
                    DETAIL_MISMATCH("number of parameters");
                    return false;
                }

                for (auto i = 0U; i < parmTys.size(); ++i) {
                    const Type* parmTy = parmTys[i];
                    if (!typeMatches(semaModel, parmTy, t.parmsTys_[i])) {
                        DETAIL_MISMATCH("parameter type mismatch");
                        return false;
                    }
                }

                ty = funcTy->returnType();
                ty = synonymizedType(semaModel, ty);

                if (!t.nestedRetTy_)
                    break;

                if (!typeMatches(semaModel, ty, *t.nestedRetTy_.get())) {
                    DETAIL_MISMATCH("nested return type mismatch");
                    return false;
                }
                return true;
            }

            default:
                PSY__internals__FAIL("unexpected");
                return false;
        }
    }

    ty = resolvedSynonymizedType(semaModel, ty);
    if (!CVRMatches(ty, t.CVR_)) {
        DETAIL_MISMATCH("type CVR");
        return false;
    }
    if (ty->kind() == TypeKind::Qualified)
        ty = ty->asQualifiedType()->unqualifiedType();
    ty = resolvedSynonymizedType(semaModel, ty);
    if (ty->kind() == TypeKind::Qualified)
        ty = ty->asQualifiedType()->unqualifiedType();

    if (ty->kind() != t.tyK_) {
        DETAIL_MISMATCH("basic/void/typedef/tag type mismatch");
        return false;
    }

    switch (ty->kind()) {
        case TypeKind::Basic:
            if (ty->asBasicType()->kind() != t.basicTyK_) {
                DETAIL_MISMATCH("basic type mismatch");
                return false;
            }
            break;

        case TypeKind::Void:
            if (t.tyK_ != TypeKind::Void) {
                DETAIL_MISMATCH("void type mismatch");
                return false;
            }
            break;

        case TypeKind::TypedefName:
            if (ty->asTypedefNameType()->typedefName()->valueText() != t.ident_) {
                DETAIL_MISMATCH("typedef name mismatch");
                return false;
            }
            break;

        case TypeKind::Tag:
            if (ty->asTagType()->kind() != t.tagTyK_) {
                DETAIL_MISMATCH("tag type mismatch");
                return false;
            }
            if (ty->asTagType()->tag()->valueText() != t.ident_
                    && !(ty->asTagType()->tag()->valueText()[0] == '#'
                         && t.ident_ == "")) {
                DETAIL_MISMATCH("tag mismatch");
                return false;
            }
            break;

        case TypeKind::Error:
            if (t.tyK_ != TypeKind::Error) {
                DETAIL_MISMATCH("unknown type mismatch");
                return false;
            }
            break;

        default:
            PSY_ASSERT_2(false, return false);
    }

    return true;
}